

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md.cpp
# Opt level: O3

mbedtls_md_info_t * mbedtls_md_info_from_string(char *md_name)

{
  int iVar1;
  mbedtls_md_info_t *pmVar2;
  
  if (md_name != (char *)0x0) {
    iVar1 = strcmp("SHA256",md_name);
    pmVar2 = (mbedtls_md_info_t *)0x0;
    if (iVar1 == 0) {
      pmVar2 = &mbedtls_sha256_info;
    }
    return pmVar2;
  }
  return (mbedtls_md_info_t *)0x0;
}

Assistant:

const mbedtls_md_info_t *mbedtls_md_info_from_string(const char *md_name)
{
    if (NULL == md_name) {
        return NULL;
    }

    const md_name_entry *entry = md_names;
    while (entry->md_name != NULL &&
           strcmp(entry->md_name, md_name) != 0) {
        ++entry;
    }

    return mbedtls_md_info_from_type(entry->md_type);
}